

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::BeginFrameObserverState>::operator=
          (CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *this,
          CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *other)

{
  type pBVar1;
  type this_00;
  CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *other_local;
  CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *this_local;
  
  pBVar1 = perfetto::std::
           unique_ptr<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
           ::operator*(&other->ptr_);
  this_00 = perfetto::std::
            unique_ptr<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
            ::operator*(&this->ptr_);
  perfetto::protos::gen::BeginFrameObserverState::operator=(this_00,pBVar1);
  return this;
}

Assistant:

CopyablePtr& operator=(const CopyablePtr& other) {
    *ptr_ = *other.ptr_;
    return *this;
  }